

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

file_status ghc::filesystem::status(path *p)

{
  file_type fVar1;
  undefined8 uVar2;
  file_status in_RDI;
  path *in_stack_00000010;
  string *in_stack_00000018;
  filesystem_error *in_stack_00000020;
  error_code in_stack_00000028;
  error_code ec;
  file_status *result;
  int in_stack_000001cc;
  file_status fVar3;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  path *in_stack_ffffffffffffff98;
  error_code local_20 [2];
  
  fVar3 = in_RDI;
  std::error_code::error_code((error_code *)in_RDI);
  status(in_stack_ffffffffffffff98,
         (error_code *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  fVar1 = file_status::type((file_status *)in_RDI);
  if (fVar1 != none) {
    return fVar3;
  }
  uVar2 = __cxa_allocate_exception(0x90);
  std::error_code::value(local_20);
  detail::systemErrorText<int>(in_stack_000001cc);
  filesystem_error::filesystem_error
            (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000028);
  __cxa_throw(uVar2,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE file_status status(const path& p)
{
    std::error_code ec;
    auto result = status(p, ec);
    if (result.type() == file_type::none) {
        throw filesystem_error(detail::systemErrorText(ec.value()), p, ec);
    }
    return result;
}